

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O0

Regexp * duckdb_re2::Regexp::Repeat(Regexp *sub,ParseFlags flags,int min,int max)

{
  Regexp *this;
  Regexp **ppRVar1;
  int in_ECX;
  int in_EDX;
  Regexp *in_RDI;
  Regexp *re;
  ParseFlags in_stack_ffffffffffffffb8;
  RegexpOp in_stack_ffffffffffffffbc;
  Regexp *in_stack_ffffffffffffffc0;
  
  this = (Regexp *)operator_new(0x28);
  Regexp(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
  AllocSub(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  ppRVar1 = Regexp::sub(this);
  *ppRVar1 = in_RDI;
  (this->arguments).repeat.min_ = in_EDX;
  (this->arguments).repeat.max_ = in_ECX;
  return this;
}

Assistant:

Regexp* Regexp::Repeat(Regexp* sub, ParseFlags flags, int min, int max) {
  Regexp* re = new Regexp(kRegexpRepeat, flags);
  re->AllocSub(1);
  re->sub()[0] = sub;
  re->arguments.repeat.min_ = min;
  re->arguments.repeat.max_ = max;
  return re;
}